

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QRect __thiscall QRect::operator&(QRect *this,QRect *r)

{
  int iVar1;
  int iVar2;
  long lVar3;
  QRect QVar4;
  bool bVar5;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  *pQVar6;
  long in_FS_OFFSET;
  Representation b2;
  Representation t2;
  Representation b1;
  Representation t1;
  Representation r2;
  Representation l2;
  Representation r1;
  Representation l1;
  QRect tmp;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  QRect *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
  in_stack_fffffffffffffecc;
  QRect *in_stack_fffffffffffffed0;
  undefined8 local_18;
  int iStack_10;
  int iStack_c;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = isNull(in_stack_fffffffffffffed0);
  if ((bVar5) || (bVar5 = isNull(in_stack_fffffffffffffed0), bVar5)) {
    QRect(in_stack_fffffffffffffec0);
  }
  else {
    QtPrivate::QCheckedIntegers::operator-<int,_true>
              (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
    bVar5 = QtPrivate::QCheckedIntegers::operator<
                      ((QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                        *)CONCAT44(in_stack_fffffffffffffecc.m_i,in_stack_fffffffffffffec8),
                       &in_stack_fffffffffffffec0->x1);
    if (bVar5) {
      QtPrivate::QCheckedIntegers::operator+<int,_true>
                (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
      QtPrivate::QCheckedIntegers::operator-<int,_true>
                (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
    }
    QtPrivate::QCheckedIntegers::operator-<int,_true>
              (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
    bVar5 = QtPrivate::QCheckedIntegers::operator<
                      ((QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                        *)CONCAT44(in_stack_fffffffffffffecc.m_i,in_stack_fffffffffffffec8),
                       &in_stack_fffffffffffffec0->x1);
    if (bVar5) {
      QtPrivate::QCheckedIntegers::operator+<int,_true>
                (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
      QtPrivate::QCheckedIntegers::operator-<int,_true>
                (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
    }
    bVar5 = QtPrivate::QCheckedIntegers::operator>
                      (&in_stack_fffffffffffffec0->x1,
                       (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                        *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if ((bVar5) ||
       (bVar5 = QtPrivate::QCheckedIntegers::operator>
                          (&in_stack_fffffffffffffec0->x1,
                           (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                            *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)), bVar5)
       ) {
      QRect(in_stack_fffffffffffffec0);
    }
    else {
      QtPrivate::QCheckedIntegers::operator-<int,_true>
                (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
      bVar5 = QtPrivate::QCheckedIntegers::operator<
                        ((QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                          *)CONCAT44(in_stack_fffffffffffffecc.m_i,in_stack_fffffffffffffec8),
                         &in_stack_fffffffffffffec0->x1);
      if (bVar5) {
        QtPrivate::QCheckedIntegers::operator+<int,_true>
                  (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
        QtPrivate::QCheckedIntegers::operator-<int,_true>
                  (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
      }
      QtPrivate::QCheckedIntegers::operator-<int,_true>
                (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
      bVar5 = QtPrivate::QCheckedIntegers::operator<
                        ((QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                          *)CONCAT44(in_stack_fffffffffffffecc.m_i,in_stack_fffffffffffffec8),
                         &in_stack_fffffffffffffec0->x1);
      if (bVar5) {
        QtPrivate::QCheckedIntegers::operator+<int,_true>
                  (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
        QtPrivate::QCheckedIntegers::operator-<int,_true>
                  (in_stack_fffffffffffffecc,in_stack_fffffffffffffebc);
      }
      bVar5 = QtPrivate::QCheckedIntegers::operator>
                        (&in_stack_fffffffffffffec0->x1,
                         (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                          *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      if ((bVar5) ||
         (bVar5 = QtPrivate::QCheckedIntegers::operator>
                            (&in_stack_fffffffffffffec0->x1,
                             (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                              *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
         bVar5)) {
        QRect(in_stack_fffffffffffffec0);
      }
      else {
        QRect(in_stack_fffffffffffffec0);
        pQVar6 = qMax<QtPrivate::QCheckedIntegers::QCheckedInt<int,QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,QtPrivate::QCheckedIntegers::AssertReportPolicy>>
                           (&in_stack_fffffffffffffec0->x1,
                            (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                             *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        iVar1 = pQVar6->m_i;
        pQVar6 = qMin<QtPrivate::QCheckedIntegers::QCheckedInt<int,QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,QtPrivate::QCheckedIntegers::AssertReportPolicy>>
                           (&in_stack_fffffffffffffec0->x1,
                            (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                             *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        iVar2 = pQVar6->m_i;
        pQVar6 = qMax<QtPrivate::QCheckedIntegers::QCheckedInt<int,QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,QtPrivate::QCheckedIntegers::AssertReportPolicy>>
                           (&in_stack_fffffffffffffec0->x1,
                            (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                             *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_18 = CONCAT44(pQVar6->m_i,iVar1);
        pQVar6 = qMin<QtPrivate::QCheckedIntegers::QCheckedInt<int,QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,QtPrivate::QCheckedIntegers::AssertReportPolicy>>
                           (&in_stack_fffffffffffffec0->x1,
                            (QCheckedInt<int,_QtPrivate::QCheckedIntegers::SafeCheckImpl<int>,_QtPrivate::QCheckedIntegers::AssertReportPolicy>
                             *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        _iStack_10 = CONCAT44(pQVar6->m_i,iVar2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  QVar4.x2.m_i = (int)_iStack_10;
  QVar4.x1.m_i = (undefined4)local_18;
  QVar4.y1.m_i = local_18._4_4_;
  QVar4.y2.m_i = (int)((ulong)_iStack_10 >> 0x20);
  return QVar4;
}

Assistant:

QRect QRect::operator&(const QRect &r) const noexcept
{
    if (isNull() || r.isNull())
        return QRect();

    Representation l1 = x1;
    Representation r1 = x2;
    if (x2 < x1 - 1) {
        l1 = x2 + 1;
        r1 = x1 - 1;
    }

    Representation l2 = r.x1;
    Representation r2 = r.x2;
    if (r.x2 < r.x1 - 1) {
        l2 = r.x2 + 1;
        r2 = r.x1 - 1;
    }

    if (l1 > r2 || l2 > r1)
        return QRect();

    Representation t1 = y1;
    Representation b1 = y2;
    if (y2 < y1 - 1) {
        t1 = y2 + 1;
        b1 = y1 - 1;
    }

    Representation t2 = r.y1;
    Representation b2 = r.y2;
    if (r.y2 < r.y1 - 1) {
        t2 = r.y2 + 1;
        b2 = r.y1 - 1;
    }

    if (t1 > b2 || t2 > b1)
        return QRect();

    QRect tmp;
    tmp.x1 = qMax(l1, l2);
    tmp.x2 = qMin(r1, r2);
    tmp.y1 = qMax(t1, t2);
    tmp.y2 = qMin(b1, b2);
    return tmp;
}